

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreadtetgen.cpp
# Opt level: O3

bool __thiscall
TPZReadTetGen::ProcessFaces
          (TPZReadTetGen *this,string *FaceFileName,TPZGeoMesh *gmesh,int64_t *numberfaces)

{
  istream *piVar1;
  mapped_type_conflict *pmVar2;
  long lVar3;
  int64_t mat;
  int64_t nfaces;
  TPZManVector<long,_3> nodind;
  int64_t BoundMarker;
  int64_t index;
  int64_t NO3;
  int64_t NO2;
  int64_t NO1;
  int64_t ID;
  ifstream FaceFile;
  ulong local_2b0;
  long local_2a8;
  TPZVec<long> local_2a0;
  mapped_type_conflict local_280 [3];
  long local_268;
  undefined1 local_260 [8];
  key_type_conflict1 local_258;
  key_type_conflict1 local_250;
  key_type_conflict1 local_248 [2];
  long local_238 [65];
  
  std::ifstream::ifstream(local_238,(FaceFileName->_M_dataplus)._M_p,_S_in);
  TPZVec<long>::TPZVec(&local_2a0,0);
  local_2a0.fStore = local_280;
  local_2a0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b688;
  local_2a0.fNElements = 3;
  local_2a0.fNAlloc = 0;
  piVar1 = std::istream::_M_extract<long>(local_238);
  std::istream::_M_extract<long>((long *)piVar1);
  *numberfaces = local_2a8;
  if (0 < local_2a8) {
    lVar3 = 0;
    do {
      piVar1 = std::istream::_M_extract<long>(local_238);
      piVar1 = std::istream::_M_extract<long>((long *)piVar1);
      piVar1 = std::istream::_M_extract<long>((long *)piVar1);
      std::istream::_M_extract<long>((long *)piVar1);
      if (local_268 == 0) {
        local_2b0 = 0xffffffffffffffff;
      }
      else {
        std::istream::_M_extract<long>(local_238);
      }
      pmVar2 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](&this->fNodeIndices,local_248);
      *local_2a0.fStore = *pmVar2;
      pmVar2 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](&this->fNodeIndices,&local_250);
      local_2a0.fStore[1] = *pmVar2;
      pmVar2 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](&this->fNodeIndices,&local_258);
      local_2a0.fStore[2] = *pmVar2;
      (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
                (gmesh,2,&local_2a0,local_2b0 & 0xffffffff,local_260,1);
      lVar3 = lVar3 + 1;
    } while (lVar3 < local_2a8);
  }
  if (local_2a0.fStore != local_280) {
    local_2a0.fNAlloc = 0;
    local_2a0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_2a0.fStore != (mapped_type_conflict *)0x0) {
      operator_delete__(local_2a0.fStore);
    }
  }
  std::ifstream::~ifstream(local_238);
  return true;
}

Assistant:

bool TPZReadTetGen::ProcessFaces(std::string FaceFileName,  TPZGeoMesh &gmesh, int64_t & numberfaces){
	
	std::ifstream FaceFile(FaceFileName.c_str());
	
	int64_t nfaces, BoundMarker, ID, mat;
	int64_t NO1, NO2, NO3, index;
	TPZManVector<int64_t,3> nodind(3);
	//TPZGeoEl * gel;
	
	FaceFile >> nfaces >> BoundMarker;
	
	numberfaces = nfaces;
	
	for(int64_t i = 0; i < nfaces; i++){
		FaceFile >> ID >> NO1 >> NO2 >> NO3;
		if (BoundMarker) FaceFile >> mat;
		else mat = -1;
		nodind[0] = this->fNodeIndices[ NO1 ];
		nodind[1] = this->fNodeIndices[ NO2 ];
		nodind[2] = this->fNodeIndices[ NO3 ];
		/*gel = */gmesh.CreateGeoElement(ETriangle, nodind, mat, index);
	}//for i
	
	return true;
	
}